

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  sysbvm_tuple_t functionDefinition;
  long lVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  long lVar7;
  ulong uVar8;
  ulong slotCount;
  bool bVar9;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar5 = *(sysbvm_tuple_t *)(*arguments + 0x60);
  functionDefinition =
       sysbvm_functionBytecodeAssembler_addLiteral
                 (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sVar5);
  lVar4 = *(long *)(sVar5 + 0x80);
  lVar7 = 0x48;
  if (lVar4 == 0) {
    lVar4 = *(long *)(sVar5 + 0x78);
    lVar7 = 0x20;
    if (lVar4 == 0) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeCompiler.c:1566: assertion failure: functionDefinition->sourceAnalyzedDefinition"
                );
      lVar4 = *(long *)(sVar5 + 0x78);
    }
  }
  uVar2 = *(ulong *)(lVar4 + lVar7);
  bVar9 = (uVar2 & 0xf) != 0;
  if (bVar9 || uVar2 == 0) {
    sVar5 = sysbvm_array_create(context,0);
  }
  else {
    uVar1 = *(uint *)(uVar2 + 0xc);
    slotCount = (ulong)(uVar1 >> 3);
    sVar5 = sysbvm_array_create(context,slotCount);
    if (7 < uVar1) {
      uVar8 = 0;
      do {
        if ((bVar9 || uVar2 == 0) ||
           (uVar3 = *(ulong *)(uVar2 + 0x10 + uVar8 * 8), (uVar3 & 0xf) != 0 || uVar3 == 0)) {
          sVar6 = 0;
        }
        else {
          sVar6 = *(sysbvm_tuple_t *)(uVar3 + 0x48);
        }
        sVar6 = sysbvm_functionBytecodeDirectCompiler_getBindingValue
                          (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],sVar6);
        if ((sVar5 & 0xf) == 0 && sVar5 != 0) {
          *(sysbvm_tuple_t *)(sVar5 + 0x10 + uVar8 * 8) = sVar6;
        }
        uVar8 = uVar8 + 1;
      } while (slotCount != uVar8);
    }
  }
  sVar6 = sysbvm_functionBytecodeAssembler_newTemporary
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                     *(sysbvm_tuple_t *)(*arguments + 0x20));
  sysbvm_functionBytecodeAssembler_makeClosureWithCaptures
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sVar6,
             functionDefinition,sVar5);
  if (*(sysbvm_tuple_t *)(*arguments + 0x68) != 0) {
    sysbvm_methodDictionary_atPut
              (context,*(sysbvm_tuple_t *)(arguments[1] + 0x18),
               *(sysbvm_tuple_t *)(*arguments + 0x68),sVar6);
  }
  return sVar6;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astLambdaNode_t **lambdaNode = (sysbvm_astLambdaNode_t**)node;

    sysbvm_functionDefinition_t *functionDefinition = (sysbvm_functionDefinition_t*)(*lambdaNode)->functionDefinition;
    sysbvm_tuple_t functionDefinitionOperand = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, (sysbvm_tuple_t)functionDefinition);

    sysbvm_tuple_t captureList = SYSBVM_NULL_TUPLE;
    if(functionDefinition->bytecode)
    {
        captureList = ((sysbvm_functionBytecode_t*)functionDefinition->bytecode)->captures;
    }
    else
    {
        SYSBVM_ASSERT(functionDefinition->sourceAnalyzedDefinition);
        captureList = ((sysbvm_functionSourceAnalyzedDefinition_t*)functionDefinition->sourceAnalyzedDefinition)->captures;
    }

    size_t captureVectorSize = sysbvm_array_getSize(captureList);
    sysbvm_tuple_t captureVector = sysbvm_array_create(context, captureVectorSize);
    
    for(size_t i = 0; i < captureVectorSize; ++i)
    {
        sysbvm_tuple_t captureBinding = sysbvm_symbolCaptureBinding_getSourceBinding(sysbvm_array_at(captureList, i));
        sysbvm_tuple_t captureValue = sysbvm_functionBytecodeDirectCompiler_getBindingValue(context, *compiler, captureBinding);

        sysbvm_array_atPut(captureVector, i, captureValue);
    }

    sysbvm_tuple_t result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*lambdaNode)->super.analyzedType);
    sysbvm_functionBytecodeAssembler_makeClosureWithCaptures(context, (*compiler)->assembler, result, functionDefinitionOperand, captureVector);

    if((*lambdaNode)->binding)
        sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, *compiler, (*lambdaNode)->binding, result);
    return result;
}